

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_2_5::jacobiSVD<double>
               (Matrix33<double> *A,Matrix33<double> *U,Vec3<double> *S,Matrix33<double> *V,
               double tol,bool forcePositiveDeterminant)

{
  undefined8 in_RDI;
  undefined1 forcePositiveDeterminant_00;
  double unaff_retaddr;
  Matrix33<double> *in_stack_00000008;
  Vec3<double> *in_stack_00000010;
  Matrix33<double> *in_stack_00000018;
  Matrix33<double> *in_stack_00000020;
  Matrix33<double> *in_stack_ffffffffffffff88;
  Matrix33<double> *in_stack_ffffffffffffff90;
  
  forcePositiveDeterminant_00 = (undefined1)((ulong)in_RDI >> 0x38);
  Matrix33<double>::Matrix33(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  anon_unknown_18::twoSidedJacobiSVD<double>
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
             (bool)forcePositiveDeterminant_00);
  return;
}

Assistant:

void
jacobiSVD (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A,
           IMATH_INTERNAL_NAMESPACE::Matrix33<T>& U,
           IMATH_INTERNAL_NAMESPACE::Vec3<T>& S,
           IMATH_INTERNAL_NAMESPACE::Matrix33<T>& V,
           const T tol,
           const bool forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}